

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

int __thiscall ncnn::Fold::forward(Fold *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  Option opt_b;
  int j;
  int i_1;
  float *ptr_1;
  int v;
  int u;
  Mat outm;
  float *sptr;
  int p;
  int gap;
  Mat top_blob_bordered;
  int channels;
  int maxk;
  int inh;
  int inw;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int max_channels;
  Mat *m;
  int i;
  float *ptr;
  int size;
  Allocator *in_stack_fffffffffffffc20;
  void **ppvVar3;
  size_t in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  int _c;
  int in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  Mat *in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  undefined1 *in_stack_fffffffffffffc50;
  Mat *in_stack_fffffffffffffc58;
  Mat *in_stack_fffffffffffffc60;
  Option *in_stack_fffffffffffffc70;
  bool local_369;
  int local_300;
  int local_2fc;
  float *local_2f8;
  int local_2f0;
  int local_2ec;
  undefined1 local_2e8 [40];
  int local_2c0;
  undefined4 local_2bc;
  int local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined8 local_2a8;
  float *local_2a0;
  int local_298;
  int local_294;
  undefined4 local_290;
  void *local_280;
  int *local_278;
  void *local_270;
  undefined4 local_268;
  long *local_260;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  void *local_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  long local_218;
  int local_20c;
  void **local_200;
  long *local_1f8;
  int local_1e4;
  void **local_1e0;
  int local_1d8;
  undefined4 local_1d4;
  void **local_1d0;
  void **local_1c8;
  int local_1b8;
  undefined4 local_1b4;
  void **local_1a8;
  void **local_1a0;
  void **local_198;
  void **local_190;
  int local_184;
  undefined1 local_175;
  int local_174;
  void **local_170;
  undefined1 *local_168;
  int local_15c;
  undefined4 *local_158;
  int local_150;
  undefined4 local_14c;
  undefined1 *local_148;
  int local_13c;
  undefined1 *local_138;
  undefined1 *local_128;
  void **local_118;
  int local_f8;
  undefined4 local_f4;
  void **local_f0;
  undefined1 *local_d0;
  void **local_b0;
  int local_a8;
  undefined4 local_a4;
  void **local_a0;
  void *local_98;
  void *local_70;
  undefined1 *local_60;
  void **local_58;
  void **local_50;
  long *local_48;
  undefined4 local_3c;
  void *local_38;
  undefined4 *local_30;
  int local_24;
  int local_20;
  int local_1c;
  Option *local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
  local_20c = (int)in_RSI[6];
  local_218 = in_RSI[2];
  local_21c = *(int *)(in_RDI + 0xd8) * (*(int *)(in_RDI + 0xd0) + -1) + 1;
  local_220 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_224 = *(int *)(in_RDI + 0xf8) + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
  local_228 = *(int *)(in_RDI + 0xfc) + *(int *)(in_RDI + 0xf0) + *(int *)(in_RDI + 0xf4);
  local_22c = (local_224 - local_21c) / *(int *)(in_RDI + 0xe0) + 1;
  local_230 = (local_228 - local_220) / *(int *)(in_RDI + 0xe4) + 1;
  local_234 = *(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xd4);
  local_238 = local_20c / local_234;
  local_1e0 = &local_280;
  local_280 = (void *)0x0;
  local_278 = (int *)0x0;
  local_270 = (void *)0x0;
  local_268 = 0;
  local_260 = (long *)0x0;
  local_258 = 0;
  local_254 = 0;
  local_250 = 0;
  local_24c = 0;
  local_248 = 0;
  local_240 = (void *)0x0;
  local_200 = in_RDX;
  local_1f8 = in_RSI;
  if ((((*(int *)(in_RDI + 0xe8) < 1) && (*(int *)(in_RDI + 0xec) < 1)) &&
      (*(int *)(in_RDI + 0xf0) < 1)) && (*(int *)(in_RDI + 0xf4) < 1)) {
    local_1a8 = &local_280;
    if (local_1a8 != in_RDX) {
      if (in_RDX[1] != (void *)0x0) {
        piVar1 = (int *)in_RDX[1];
        local_1b4 = 1;
        LOCK();
        local_1b8 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_280 = *in_RDX;
      local_278 = (int *)in_RDX[1];
      local_270 = in_RDX[2];
      local_268 = *(undefined4 *)(in_RDX + 3);
      local_260 = (long *)in_RDX[4];
      local_258 = *(int *)(in_RDX + 5);
      local_254 = *(int *)((long)in_RDX + 0x2c);
      local_250 = *(int *)(in_RDX + 6);
      local_24c = *(int *)((long)in_RDX + 0x34);
      local_248 = *(int *)(in_RDX + 7);
      local_240 = in_RDX[8];
      local_b0 = local_1a8;
    }
    local_1a0 = local_1a8;
    Mat::create(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,_c,
                in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  }
  else {
    Mat::create(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,_c,
                in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  }
  local_190 = &local_280;
  if (local_280 != (void *)0x0) {
    local_58 = local_190;
  }
  local_369 = local_280 != (void *)0x0 && (long)local_240 * (long)local_248 != 0;
  if (local_369) {
    local_294 = local_224 * *(int *)(in_RDI + 0xe4) - local_22c * *(int *)(in_RDI + 0xe0);
    for (local_298 = 0; local_298 < local_238; local_298 = local_298 + 1) {
      local_184 = local_298 * local_234;
      local_2a0 = (float *)(*local_1f8 +
                           (long)*(int *)((long)local_1f8 + 0x2c) * (long)local_184 * local_1f8[2]);
      local_168 = local_2e8;
      local_170 = &local_280;
      local_30 = (undefined4 *)
                 ((long)local_280 + (long)local_240 * (long)local_298 * (long)local_270);
      in_stack_fffffffffffffc70 = (Option *)local_2e8;
      local_8 = (long)local_254 * (long)local_250 * (long)local_270;
      local_2a8._0_4_ = (int)((local_8 + 0xfU & 0xfffffffffffffff0) / (ulong)local_270);
      if (local_258 == 4) {
        local_2a8._0_4_ = local_254 * local_250;
      }
      local_148 = local_2e8;
      local_150 = (int)local_2a8 * local_24c;
      local_158 = local_30;
      for (local_15c = 0; local_15c < local_150; local_15c = local_15c + 1) {
        *local_158 = 0;
        local_158 = local_158 + 1;
      }
      for (local_2ec = 0; local_2ec < *(int *)(in_RDI + 0xd4); local_2ec = local_2ec + 1) {
        for (local_2f0 = 0; local_2f0 < *(int *)(in_RDI + 0xd0); local_2f0 = local_2f0 + 1) {
          local_13c = *(int *)(in_RDI + 0xdc) * local_2ec;
          local_138 = local_2e8;
          in_stack_fffffffffffffc58 =
               (Mat *)((long)local_30 + (long)local_254 * (long)local_13c * (long)local_270);
          local_2f8 = (float *)((long)&in_stack_fffffffffffffc58->data +
                               (long)(*(int *)(in_RDI + 0xd8) * local_2f0) * 4);
          for (local_2fc = 0; local_2fc < local_230; local_2fc = local_2fc + 1) {
            for (local_300 = 0; local_300 < local_22c; local_300 = local_300 + 1) {
              *local_2f8 = *local_2a0 + *local_2f8;
              local_2f8 = local_2f8 + *(int *)(in_RDI + 0xe0);
              local_2a0 = local_2a0 + 1;
            }
            local_2f8 = local_2f8 + local_294;
          }
        }
      }
      in_stack_fffffffffffffc50 = local_2e8;
      local_2e8._32_8_ = local_260;
      local_c = 0x10;
      local_1c = local_254;
      local_20 = local_250;
      local_24 = local_24c;
      local_38 = local_270;
      local_3c = local_268;
      local_48 = local_260;
      local_14c = 0;
      local_174 = local_298;
      local_175 = 1;
      local_2e8[0] = false;
      local_2e8[1] = false;
      local_2e8[2] = false;
      local_2e8[3] = false;
      local_2e8._4_4_ = 0;
      local_2e8._16_8_ = (Allocator *)0x0;
      local_2e8._24_4_ = 0;
      local_2c0 = 0;
      local_2bc._0_1_ = false;
      local_2bc._1_1_ = false;
      local_2bc._2_1_ = false;
      local_2bc._3_1_ = false;
      local_2b8 = 0;
      local_2b4._0_1_ = false;
      local_2b4._1_1_ = false;
      local_2b4._2_1_ = false;
      local_2b4._3_1_ = false;
      local_2b0._0_1_ = false;
      local_2b0._1_1_ = false;
      local_2b0._2_1_ = false;
      local_2b0._3_1_ = false;
      local_2a8 = 0;
      local_2e8._8_8_ = (Allocator *)0x0;
      local_128 = in_stack_fffffffffffffc50;
      local_d0 = in_stack_fffffffffffffc50;
      local_60 = local_148;
      local_18 = in_stack_fffffffffffffc70;
    }
    if (((*(int *)(in_RDI + 0xe8) < 1) && (*(int *)(in_RDI + 0xec) < 1)) &&
       ((*(int *)(in_RDI + 0xf0) < 1 && (*(int *)(in_RDI + 0xf4) < 1)))) {
      local_1c8 = local_200;
      local_1d0 = &local_280;
      if (local_200 != local_1d0) {
        if (local_278 != (int *)0x0) {
          local_1d4 = 1;
          LOCK();
          local_1d8 = *local_278;
          *local_278 = *local_278 + 1;
          UNLOCK();
        }
        local_a0 = local_200;
        ppvVar3 = local_200;
        if (local_200[1] != (void *)0x0) {
          piVar1 = (int *)local_200[1];
          local_a4 = 0xffffffff;
          LOCK();
          local_a8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_a8 == 1) {
            if (local_200[4] == (void *)0x0) {
              local_98 = *local_200;
              if (local_98 != (void *)0x0) {
                free(local_98);
              }
            }
            else {
              (**(code **)(*local_200[4] + 0x18))(local_200[4],*local_200);
            }
          }
        }
        *local_200 = (void *)0x0;
        local_200[2] = (void *)0x0;
        *(undefined4 *)(local_200 + 3) = 0;
        *(undefined4 *)(local_200 + 5) = 0;
        *(undefined4 *)((long)local_200 + 0x2c) = 0;
        *(undefined4 *)(local_200 + 6) = 0;
        *(undefined4 *)((long)local_200 + 0x34) = 0;
        *(undefined4 *)(local_200 + 7) = 0;
        local_200[8] = (void *)0x0;
        local_200[1] = (void *)0x0;
        *ppvVar3 = *local_1d0;
        ppvVar3[1] = local_1d0[1];
        ppvVar3[2] = local_1d0[2];
        *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_1d0 + 3);
        ppvVar3[4] = local_1d0[4];
        *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_1d0 + 5);
        *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_1d0 + 0x2c);
        *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_1d0 + 6);
        *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_1d0 + 0x34);
        *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_1d0 + 7);
        ppvVar3[8] = local_1d0[8];
      }
    }
    else {
      copy_cut_border(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                      (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),(int)in_stack_fffffffffffffc50
                      ,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,in_stack_fffffffffffffc70
                     );
      local_198 = local_200;
      bVar2 = true;
      if (*local_200 != (void *)0x0) {
        local_50 = local_200;
        bVar2 = (long)local_200[8] * (long)*(int *)(local_200 + 7) == 0;
      }
      if (bVar2) {
        local_1e4 = -100;
        goto LAB_01ee7a3a;
      }
    }
    local_1e4 = 0;
  }
  else {
    local_1e4 = -100;
  }
LAB_01ee7a3a:
  local_290 = 1;
  ppvVar3 = &local_280;
  if (local_278 != (int *)0x0) {
    local_f4 = 0xffffffff;
    LOCK();
    local_f8 = *local_278;
    *local_278 = *local_278 + -1;
    UNLOCK();
    if (local_f8 == 1) {
      local_118 = ppvVar3;
      local_f0 = ppvVar3;
      if (local_260 == (long *)0x0) {
        local_70 = local_280;
        if (local_280 != (void *)0x0) {
          free(local_280);
        }
      }
      else {
        (**(code **)(*local_260 + 0x18))(local_260,local_280);
      }
    }
  }
  *ppvVar3 = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  *(undefined4 *)(ppvVar3 + 3) = 0;
  *(undefined4 *)(ppvVar3 + 5) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
  *(undefined4 *)(ppvVar3 + 6) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
  *(undefined4 *)(ppvVar3 + 7) = 0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  return local_1e4;
}

Assistant:

int Fold::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int max_channels = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = output_w + pad_left + pad_right;
    const int outh = output_h + pad_top + pad_bottom;

    const int inw = (outw - kernel_extent_w) / stride_w + 1;
    const int inh = (outh - kernel_extent_h) / stride_h + 1;

    // assert inw * inh == size

    const int maxk = kernel_w * kernel_h;
    const int channels = max_channels / maxk;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        top_blob_bordered.create(outw, outh, channels, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, channels, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    // col2im
    const int gap = outw * stride_h - inw * stride_w;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* sptr = bottom_blob.row(p * maxk);
        Mat outm = top_blob_bordered.channel(p);

        outm.fill(0.f);

        for (int u = 0; u < kernel_h; u++)
        {
            for (int v = 0; v < kernel_w; v++)
            {
                float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                for (int i = 0; i < inh; i++)
                {
                    for (int j = 0; j < inw; j++)
                    {
                        ptr[0] += sptr[0];

                        ptr += stride_w;
                        sptr += 1;
                    }

                    ptr += gap;
                }
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.use_packing_layout = false;
        copy_cut_border(top_blob_bordered, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt_b);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}